

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# InterpreterStackFrame.h
# Opt level: O3

void __thiscall
Js::InterpreterStackFrame::
OP_CallI<Js::OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>>__unaligned>
          (InterpreterStackFrame *this,
          OpLayoutT_CallI<Js::LayoutSizePolicy<(Js::LayoutSize)0>_> *playout)

{
  ValidateRegValue(this,*(Var *)(this + (ulong)playout->Function * 8 + 0x160),true,true);
}

Assistant:

void OP_CallIFlags(const unaligned T* playout) { OP_CallCommon(playout, OP_CallGetFunc(GetRegAllowStackVar(playout->Function)), playout->callFlags); }